

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall WavingSketch<8U,_1U,_4U>::shrink(WavingSketch<8U,_1U,_4U> *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  WavingSketch<8U,_1U,_4U> *pWVar5;
  long in_RDI;
  Bucket *in_stack_00000018;
  Bucket *in_stack_00000020;
  Bucket *in_stack_00000028;
  WavingSketch<8U,_1U,_4U> *in_stack_00000030;
  uint32_t i;
  Bucket *tpbuck;
  uint32_t num;
  WavingSketch<8U,_1U,_4U> *in_stack_ffffffffffffffa0;
  WavingSketch<8U,_1U,_4U> *in_stack_ffffffffffffffa8;
  WavingSketch<8U,_1U,_4U> *in_stack_ffffffffffffffb0;
  uint local_28;
  
  if ((*(uint *)(in_RDI + 0x78) & 1) != 0) {
    printf("Bucket num %d is odd, can NOT shrink!\n",(ulong)*(uint *)(in_RDI + 0x78));
    printf("FATAL ERROR!\n");
    exit(-1);
  }
  uVar2 = *(int *)(in_RDI + 0x78) + 1U >> 1;
  uVar3 = CONCAT44(0,uVar2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x44),0);
  if (SUB168(auVar1 * ZEXT816(0x44),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pWVar5 = (WavingSketch<8U,_1U,_4U> *)operator_new__(uVar4);
  if (uVar3 != 0) {
    in_stack_ffffffffffffffa8 =
         (WavingSketch<8U,_1U,_4U> *)
         ((long)&(pWVar5->super_Abstract<4U>)._vptr_Abstract + uVar3 * 0x44);
    in_stack_ffffffffffffffb0 = pWVar5;
    do {
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffb0;
      Bucket::Bucket((Bucket *)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffb0 =
           (WavingSketch<8U,_1U,_4U> *)
           ((long)&(in_stack_ffffffffffffffa0->super_Abstract<4U>).are + 4);
    } while (in_stack_ffffffffffffffb0 != in_stack_ffffffffffffffa8);
  }
  for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
    if (local_28 + uVar2 < *(uint *)(in_RDI + 0x78)) {
      mergebuck(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
    }
    else {
      copybuck(in_stack_ffffffffffffffb0,(Bucket *)in_stack_ffffffffffffffa8,
               (Bucket *)in_stack_ffffffffffffffa0);
    }
  }
  *(uint *)(in_RDI + 0x78) = uVar2;
  if (*(void **)(in_RDI + 0x70) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x70));
  }
  *(WavingSketch<8U,_1U,_4U> **)(in_RDI + 0x70) = pWVar5;
  return;
}

Assistant:

void shrink() {
		// shrink to half of total buckets
		if (BUCKET_NUM % 2) {
			printf("Bucket num %d is odd, can NOT shrink!\n", BUCKET_NUM);
			printf("FATAL ERROR!\n");
			exit(-1);
		}
		uint32_t num = (BUCKET_NUM + 1) >> 1;
		Bucket* tpbuck = new Bucket[num];
		for (uint32_t i = 0; i < num; i++) {
			if (i + num < BUCKET_NUM)
				mergebuck(&buckets[i], &buckets[i + num], &tpbuck[i]);
			else
				copybuck(&buckets[i], &tpbuck[i]);
		}
		BUCKET_NUM = num;
		delete[] buckets;
		buckets = tpbuck;
	}